

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

string * cs_impl::string_cs_ext::append(string *str,var *val)

{
  string *in_RSI;
  string *in_RDI;
  any *in_stack_ffffffffffffffc8;
  
  any::to_string_abi_cxx11_(in_stack_ffffffffffffffc8);
  std::__cxx11::string::append(in_RSI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

string append(string &str, const var &val)
		{
			str.append(val.to_string());
			return str;
		}